

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

bool __thiscall toml::internal::Lexer::skipUTF8BOM(Lexer *this)

{
  int iVar1;
  int x3;
  int x2;
  int x1;
  undefined1 local_1;
  
  iVar1 = std::istream::peek();
  if (iVar1 == 0xef) {
    std::istream::get();
    iVar1 = std::istream::get();
    if (iVar1 == 0xbb) {
      iVar1 = std::istream::get();
      if (iVar1 == 0xbf) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool Lexer::skipUTF8BOM()
{
    // Check [EF, BB, BF]

    int x1 = is_.peek();
    if (x1 != 0xEF) {
        // When the first byte is not 0xEF, it's not UTF8 BOM.
        // Just return true.
        return true;
    }

    is_.get();
    int x2 = is_.get();
    if (x2 != 0xBB) {
        return false;
    }

    int x3 = is_.get();
    if (x3 != 0xBF) {
        return false;
    }

    return true;
}